

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O0

int mocked_printf(FILE *file,char *format,...)

{
  size_t sVar1;
  char *in_RSI;
  undefined8 in_RDI;
  va_list ap;
  char buffer [10000];
  char *in_stack_ffffffffffffd808;
  char *in_stack_ffffffffffffd810;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined1 *local_2740;
  undefined1 *local_2738;
  char local_2728 [10008];
  char *local_10;
  undefined8 local_8;
  
  local_2738 = &stack0xffffffffffffd808;
  local_2740 = &stack0x00000008;
  local_2744 = 0x30;
  local_2748 = 0x10;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vsnprintf(local_2728,10000,in_RSI,&local_2748);
  output = concat(in_stack_ffffffffffffd810,in_stack_ffffffffffffd808);
  sVar1 = strlen(output);
  return (int)sVar1;
}

Assistant:

static int mocked_printf(FILE *file, const char *format, ...) {
    char buffer[10000];
    va_list ap;
    va_start(ap, format);
    vsnprintf(buffer, sizeof(buffer), format, ap);
    va_end(ap);

    (void)file;
    output = concat(output, buffer);
    return strlen(output);
}